

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

Value * __thiscall Json::Value::operator[](Value *this,int index)

{
  Value *pVVar1;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [376];
  
  if (-1 < index) {
    pVVar1 = operator[](this,index);
    return pVVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,"in Json::Value::operator[](int index): index cannot be negative",
             0x3f);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
}

Assistant:

Value& Value::operator[](int index) {
  JSON_ASSERT_MESSAGE(
      index >= 0,
      "in Json::Value::operator[](int index): index cannot be negative");
  return (*this)[ArrayIndex(index)];
}